

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

void subip_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  bool bVar1;
  bool bVar2;
  size_t local_40;
  size_t ib;
  size_t ia;
  _Bool carry;
  size_t nb_local;
  size_t na_local;
  uint16_t *b_local;
  uint16_t *a_local;
  
  bVar1 = false;
  local_40 = nb;
  ib = na;
  while (local_40 != 0 && ib != 0) {
    ib = ib - 1;
    local_40 = local_40 - 1;
    if (bVar1) {
      bVar1 = a[ib] <= b[local_40];
      if (bVar1) {
        a[ib] = a[ib] + (-1 - b[local_40]);
      }
      else {
        a[ib] = a[ib] - (b[local_40] + 1);
      }
    }
    else if (a[ib] < b[local_40]) {
      a[ib] = a[ib] + (-1 - (b[local_40] - 1));
      bVar1 = true;
    }
    else {
      a[ib] = a[ib] - b[local_40];
    }
  }
  while (local_40 != 0) {
    local_40 = local_40 - 1;
    if (b[local_40] != 0) {
      __assert_fail("!b[ib]",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                    ,0x4be,"void subip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
    }
  }
  while( true ) {
    bVar2 = false;
    if (ib != 0) {
      bVar2 = bVar1;
    }
    if (!bVar2) break;
    ib = ib - 1;
    if (a[ib] == 0) {
      a[ib] = 0xffff;
    }
    else {
      a[ib] = a[ib] - 1;
      bVar1 = false;
    }
  }
  if (!bVar1) {
    return;
  }
  __assert_fail("!carry",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-util.c"
                ,0x4ca,"void subip_u16n(uint16_t *, const uint16_t *, size_t, size_t)");
}

Assistant:

static void subip_u16n(uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	bool carry = false;
	size_t ia = na, ib = nb;

	while (ib > 0 && ia > 0) {
		--ia;
		--ib;
		if (carry) {
			if (a[ia] > b[ib]) {
				a[ia] -= b[ib] + 1;
				carry = false;
			} else {
				a[ia] += (uint16_t)65535 - b[ib];
				carry = true;
			}
		} else if (a[ia] >= b[ib]) {
			a[ia] -= b[ib];
		} else {
			a[ia] += (uint16_t)65535 - (b[ib] - 1);
			carry = true;
		}
	}
#ifndef NDEBUG
	while (ib > 0) {
		--ib;
		assert(!b[ib]);
	}
#endif
	while (ia > 0 && carry) {
		--ia;
		if (a[ia]) {
			a[ia] -= 1;
			carry = false;
		} else {
			a[ia] = 65535;
		}
	}
	assert(!carry);
}